

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,double,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,false,false>
               (double *ldata,double *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  double dVar1;
  double dVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      ExecuteFlatLoop<double,double,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,false,false>
                ();
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar6 = 0;
    uVar8 = 0;
    do {
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar7 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar7 = count;
        }
LAB_00349d6a:
        uVar10 = uVar8;
        if (uVar8 < uVar7) {
          do {
            dVar1 = ldata[uVar8];
            dVar2 = rdata[uVar8];
            bVar5 = Value::IsNan<double>(dVar1);
            if ((bVar5) && (bVar5 = Value::IsNan<double>(dVar2), bVar5)) {
              bVar5 = false;
            }
            else {
              bVar5 = (bool)(-(dVar1 != dVar2) & 1);
            }
            result_data[uVar8] = bVar5;
            uVar8 = uVar8 + 1;
            uVar10 = uVar7;
          } while (uVar7 != uVar8);
        }
      }
      else {
        uVar4 = puVar3[uVar6];
        uVar7 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar7 = count;
        }
        uVar10 = uVar7;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_00349d6a;
          uVar10 = uVar8;
          if (uVar8 < uVar7) {
            uVar9 = 0;
            do {
              if ((uVar4 >> (uVar9 & 0x3f) & 1) != 0) {
                dVar1 = ldata[uVar8 + uVar9];
                dVar2 = rdata[uVar8 + uVar9];
                bVar5 = Value::IsNan<double>(dVar1);
                if ((bVar5) && (bVar5 = Value::IsNan<double>(dVar2), bVar5)) {
                  bVar5 = false;
                }
                else {
                  bVar5 = (bool)(-(dVar1 != dVar2) & 1);
                }
                result_data[uVar9 + uVar8] = bVar5;
              }
              uVar9 = uVar9 + 1;
              uVar10 = uVar7;
            } while (uVar7 - uVar8 != uVar9);
          }
        }
      }
      uVar6 = uVar6 + 1;
      uVar8 = uVar10;
    } while (uVar6 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}